

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O2

pcp_server_state_e handle_wait_io_receive_msg(pcp_server_t *s)

{
  pcp_ctx_t *ppVar1;
  pcp_server_state_e pVar2;
  pcp_flow_t *ppVar3;
  time_t tVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  time_t tVar8;
  uint uVar9;
  
  ppVar1 = s->ctx;
  pcp_logger(PCP_LOGLVL_INFO,
             "Received PCP packet from server at %s, size %d, result_code %d, epoch %d",
             s->pcp_server_paddr,(ulong)(ppVar1->msg).pcp_msg_len,(ulong)(ppVar1->msg).recv_result,
             (ulong)(ppVar1->msg).recv_epoch);
  uVar6 = (ppVar1->msg).recv_result;
  if (uVar6 == 0xc) {
    pcp_logger(PCP_LOGLVL_WARN,
               "There is PCP-unaware NAT present between client and PCP server %s. Sending of PCP messages was disabled."
               ,s->pcp_server_paddr);
    gettimeofday((timeval *)&s->next_timeout,(__timezone_ptr_t)0x0);
    pVar2 = pss_set_not_working;
  }
  else if (uVar6 == 1) {
    gettimeofday((timeval *)&s->next_timeout,(__timezone_ptr_t)0x0);
    s->next_version = (uint8_t)(ppVar1->msg).recv_version;
    pVar2 = pss_version_negotiation;
  }
  else {
    ppVar3 = server_process_rcvd_pcp_msg(s,&ppVar1->msg);
    uVar6 = s->epoch;
    if (uVar6 == 0xffffffff) {
      uVar6 = (ppVar1->msg).recv_epoch;
      s->epoch = uVar6;
      tVar4 = (ppVar1->msg).received_time;
      s->cepoch = tVar4;
      tVar8 = tVar4;
      uVar5 = uVar6;
    }
    else {
      tVar4 = (ppVar1->msg).received_time;
      tVar8 = s->cepoch;
      uVar5 = (ppVar1->msg).recv_epoch;
    }
    uVar9 = (int)tVar4 - (int)tVar8;
    uVar7 = uVar5 - uVar6;
    if ((uVar9 + 2 < uVar7 - (uVar7 >> 4)) || (uVar7 + 2 < uVar9 - (uVar9 >> 4))) {
      s->epoch = uVar5;
      s->cepoch = tVar4;
      gettimeofday((timeval *)&s->next_timeout,(__timezone_ptr_t)0x0);
      s->restart_flow_msg = ppVar3;
      pVar2 = pss_server_restart;
    }
    else {
      gettimeofday((timeval *)&s->next_timeout,(__timezone_ptr_t)0x0);
      pVar2 = pss_wait_io_calc_nearest_timeout;
    }
  }
  return pVar2;
}

Assistant:

static pcp_server_state_e handle_wait_io_receive_msg(pcp_server_t *s) {
    pcp_recv_msg_t *msg = &s->ctx->msg;
    pcp_flow_t *f;

    PCP_LOG(PCP_LOGLVL_INFO,
            "Received PCP packet from server at %s, size %d, result_code %d, "
            "epoch %d",
            s->pcp_server_paddr, msg->pcp_msg_len, msg->recv_result,
            msg->recv_epoch);

    switch (msg->recv_result) {
    case PCP_RES_UNSUPP_VERSION:
        PCP_LOG(PCP_LOGLVL_DEBUG,
                "PCP server %s returned "
                "result_code=Unsupported version",
                s->pcp_server_paddr);
        gettimeofday(&s->next_timeout, NULL);
        s->next_version = msg->recv_version;
        return pss_version_negotiation;
    case PCP_RES_ADDRESS_MISMATCH:
        PCP_LOG(PCP_LOGLVL_WARN,
                "There is PCP-unaware NAT present "
                "between client and PCP server %s. "
                "Sending of PCP messages was disabled.",
                s->pcp_server_paddr);
        gettimeofday(&s->next_timeout, NULL);
        return pss_set_not_working;
    }

    f = server_process_rcvd_pcp_msg(s, msg);

    if (compare_epochs(msg, s)) {
        s->epoch = msg->recv_epoch;
        s->cepoch = msg->received_time;
        gettimeofday(&s->next_timeout, NULL);
        s->restart_flow_msg = f;

        return pss_server_restart;
    }

    gettimeofday(&s->next_timeout, NULL);

    return pss_wait_io_calc_nearest_timeout;
}